

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::InlinePass::InlineSingleInstruction
          (InlinePass *this,
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *callee2caller,BasicBlock *new_blk_ptr,Instruction *inst,uint32_t dbg_inlined_at)

{
  array<signed_char,_4UL> to;
  pointer pOVar1;
  uint **ppuVar2;
  IRContext *this_00;
  bool bVar3;
  char cVar4;
  uint32_t uVar5;
  Instruction *this_01;
  const_iterator cVar6;
  uint **ppuVar7;
  pointer pOVar8;
  uint32_t rid;
  undefined1 local_90 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_70;
  InlinePass *local_68;
  BasicBlock *local_60;
  uint *local_58;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *local_50;
  undefined8 local_48;
  code *local_40;
  code *local_38;
  
  if (inst->opcode_ - OpReturn < 2) {
    return true;
  }
  local_68 = this;
  this_01 = Instruction::Clone(inst,(this->super_Pass).context_);
  local_90._0_8_ = &local_50;
  local_48 = 0;
  local_38 = std::
             _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inline_pass.cpp:354:24)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inline_pass.cpp:354:24)>
             ::_M_manager;
  local_90._8_8_ = 0;
  local_90._24_8_ =
       std::
       _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:830:17)>
       ::_M_invoke;
  local_90._16_8_ =
       std::
       _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:830:17)>
       ::_M_manager;
  pOVar8 = (this_01->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pOVar1 = (this_01->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_50 = callee2caller;
  if (pOVar8 != pOVar1) {
    local_60 = new_blk_ptr;
    do {
      bVar3 = spvIsInIdType(pOVar8->type);
      if (bVar3) {
        ppuVar2 = (uint **)(pOVar8->words).large_data_._M_t.
                           super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           .
                           super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                           ._M_head_impl;
        ppuVar7 = &(pOVar8->words).small_data_;
        if (ppuVar2 != (uint **)0x0) {
          ppuVar7 = ppuVar2;
        }
        local_58 = *ppuVar7;
        if ((PodType  [2])local_90._16_8_ == (PodType  [2])0x0) {
          std::__throw_bad_function_call();
        }
        cVar4 = (*(code *)local_90._24_8_)(local_90,&local_58);
        if (cVar4 == '\0') break;
      }
      pOVar8 = pOVar8 + 1;
    } while (pOVar8 != pOVar1);
    new_blk_ptr = local_60;
    if ((PodType  [2])local_90._16_8_ == (PodType  [2])0x0) goto LAB_0021df5b;
  }
  (*(code *)local_90._16_8_)(local_90,local_90,3);
LAB_0021df5b:
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,3);
  }
  if (this_01->has_result_id_ == false) {
    local_50 = (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                *)((ulong)local_50 & 0xffffffff00000000);
  }
  else {
    uVar5 = Instruction::GetSingleWordOperand(this_01,(uint)this_01->has_type_id_);
    local_50 = (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                *)CONCAT44(local_50._4_4_,uVar5);
    if (uVar5 != 0) {
      cVar6 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&callee2caller->_M_h,(key_type_conflict *)&local_50);
      if (cVar6.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
          == (__node_type *)0x0) {
        (*(this_01->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase[1])
                  (this_01);
        return false;
      }
      if (this_01->has_result_id_ == false) {
        __assert_fail("has_result_id_",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                      ,0x2c8,"void spvtools::opt::Instruction::SetResultId(uint32_t)");
      }
      to._M_elems = *&((array<signed_char,_4UL> *)
                      ((long)cVar6.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                             ._M_cur + 0xc))->_M_elems;
      if (to._M_elems == (_Type)0x0) {
        __assert_fail("res_id != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                      ,0x2cd,"void spvtools::opt::Instruction::SetResultId(uint32_t)");
      }
      local_90._24_8_ = local_90 + 0x10;
      local_90._0_8_ = &PTR__SmallVector_003d7c78;
      local_70._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_90[0x10] = to._M_elems[0];
      local_90[0x11] = to._M_elems[1];
      local_90[0x12] = to._M_elems[2];
      local_90[0x13] = to._M_elems[3];
      local_90._8_8_ = 1;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)
                 ((long)&((OperandData *)
                         ((((this_01->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_start)->words).buffer + -4))->
                         _vptr_SmallVector + (ulong)((uint)this_01->has_type_id_ * 0x30)),
                 (SmallVector<unsigned_int,_2UL> *)local_90);
      local_90._0_8_ = &PTR__SmallVector_003d7c78;
      if (local_70._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_70,local_70._M_head_impl);
      }
      this_00 = (local_68->super_Pass).context_;
      if ((this_00->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
        IRContext::BuildDecorationManager(this_00);
      }
      analysis::DecorationManager::CloneDecorations
                ((this_00->decoration_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
                 _M_head_impl,(uint32_t)local_50,(uint32_t)to._M_elems);
    }
  }
  Instruction::UpdateDebugInlinedAt(this_01,dbg_inlined_at);
  utils::IntrusiveList<spvtools::opt::Instruction>::push_back
            (&(new_blk_ptr->insts_).super_IntrusiveList<spvtools::opt::Instruction>,this_01);
  return true;
}

Assistant:

bool InlinePass::InlineSingleInstruction(
    const std::unordered_map<uint32_t, uint32_t>& callee2caller,
    BasicBlock* new_blk_ptr, const Instruction* inst, uint32_t dbg_inlined_at) {
  // If we have return, it must be at the end of the callee. We will handle
  // it at the end.
  if (inst->opcode() == spv::Op::OpReturnValue ||
      inst->opcode() == spv::Op::OpReturn)
    return true;

  // Copy callee instruction and remap all input Ids.
  std::unique_ptr<Instruction> cp_inst(inst->Clone(context()));
  cp_inst->ForEachInId([&callee2caller](uint32_t* iid) {
    const auto mapItr = callee2caller.find(*iid);
    if (mapItr != callee2caller.end()) {
      *iid = mapItr->second;
    }
  });

  // If result id is non-zero, remap it.
  const uint32_t rid = cp_inst->result_id();
  if (rid != 0) {
    const auto mapItr = callee2caller.find(rid);
    if (mapItr == callee2caller.end()) {
      return false;
    }
    uint32_t nid = mapItr->second;
    cp_inst->SetResultId(nid);
    get_decoration_mgr()->CloneDecorations(rid, nid);
  }

  cp_inst->UpdateDebugInlinedAt(dbg_inlined_at);
  new_blk_ptr->AddInstruction(std::move(cp_inst));
  return true;
}